

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O1

void Gia_ManHashResize(Gia_Man_t *p)

{
  uint uVar1;
  int *__ptr;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  uint uVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  Gia_Obj_t *pGVar13;
  
  __ptr = p->pHTable;
  if (__ptr == (int *)0x0) {
    __assert_fail("p->pHTable != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                  ,0xa8,"void Gia_ManHashResize(Gia_Man_t *)");
  }
  uVar1 = p->nHTable;
  uVar9 = (~(p->vCos->nSize + p->vCis->nSize) + p->nObjs) * 2 - 1;
  while( true ) {
    do {
      uVar6 = uVar9 + 1;
      uVar4 = uVar9 & 1;
      uVar9 = uVar6;
    } while (uVar4 != 0);
    if (uVar6 < 9) break;
    iVar10 = 5;
    while (uVar6 % (iVar10 - 2U) != 0) {
      uVar4 = iVar10 * iVar10;
      iVar10 = iVar10 + 2;
      if (uVar6 < uVar4) goto LAB_006b1843;
    }
  }
LAB_006b1843:
  p->nHTable = uVar6;
  piVar5 = (int *)calloc((long)(int)uVar6,4);
  p->pHTable = piVar5;
  if ((int)uVar1 < 1) {
    iVar10 = 0;
  }
  else {
    uVar12 = 0;
    iVar10 = 0;
    do {
      uVar9 = __ptr[uVar12];
      if (uVar9 == 0) {
        pGVar13 = (Gia_Obj_t *)0x0;
      }
      else {
        if ((int)uVar9 < 0) {
LAB_006b1acd:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10c,"int Abc_Lit2Var(int)");
        }
        if (p->nObjs <= (int)(uVar9 >> 1)) {
LAB_006b1aae:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar13 = p->pObjs + (uVar9 >> 1);
      }
      if (pGVar13 == (Gia_Obj_t *)0x0) {
        uVar9 = 0;
      }
      else {
        uVar9 = pGVar13->Value;
      }
      while (pGVar13 != (Gia_Obj_t *)0x0) {
        pGVar13->Value = 0;
        pGVar2 = p->pObjs;
        if ((pGVar13 < pGVar2) || (pGVar2 + p->nObjs <= pGVar13)) {
LAB_006b1a32:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar7 = (int)((long)pGVar13 - (long)pGVar2 >> 2) * -0x55555555;
        uVar3 = *(ulong *)pGVar13;
        iVar8 = iVar7 - ((uint)uVar3 & 0x1fffffff);
        if (iVar8 < 0) {
LAB_006b1a51:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10b,"int Abc_Var2Lit(int, int)");
        }
        uVar4 = (uint)(uVar3 >> 0x20);
        iVar11 = iVar7 - (uVar4 & 0x1fffffff);
        if (iVar11 < 0) goto LAB_006b1a51;
        if (p->pMuxes == (uint *)0x0) {
          uVar6 = 0xffffffff;
        }
        else {
          uVar6 = p->pMuxes[iVar7];
          uVar6 = -(uint)(uVar6 == 0) | uVar6;
        }
        piVar5 = Gia_ManHashFind(p,((uint)(uVar3 >> 0x1d) & 1) + iVar8 * 2,
                                 (uVar4 >> 0x1d & 1) + iVar11 * 2,uVar6);
        if (*piVar5 != 0) {
          __assert_fail("*pPlace == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                        ,0xb8,"void Gia_ManHashResize(Gia_Man_t *)");
        }
        pGVar2 = p->pObjs;
        if ((pGVar13 < pGVar2) || (pGVar2 + p->nObjs <= pGVar13)) goto LAB_006b1a32;
        iVar8 = (int)((ulong)((long)pGVar13 - (long)pGVar2) >> 2);
        iVar7 = iVar8 * -0x55555555;
        if (iVar7 < 0) goto LAB_006b1a51;
        *piVar5 = iVar8 * 0x55555556;
        if (iVar7 == 0) {
          __assert_fail("*pPlace != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                        ,0xba,"void Gia_ManHashResize(Gia_Man_t *)");
        }
        if (uVar9 == 0) {
          pGVar13 = (Gia_Obj_t *)0x0;
        }
        else {
          if ((int)uVar9 < 0) goto LAB_006b1acd;
          if (p->nObjs <= (int)(uVar9 >> 1)) goto LAB_006b1aae;
          pGVar13 = pGVar2 + (uVar9 >> 1);
        }
        if (pGVar13 == (Gia_Obj_t *)0x0) {
          uVar9 = 0;
        }
        else {
          uVar9 = pGVar13->Value;
        }
        iVar10 = iVar10 + 1;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar1);
  }
  if (iVar10 != (~(p->vCos->nSize + p->vCis->nSize) + p->nObjs) - p->nBufs) {
    __assert_fail("Counter == Counter2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                  ,0xbe,"void Gia_ManHashResize(Gia_Man_t *)");
  }
  free(__ptr);
  return;
}

Assistant:

void Gia_ManHashResize( Gia_Man_t * p )
{
    Gia_Obj_t * pThis;
    int * pHTableOld, * pPlace;
    int nHTableOld, iNext, Counter, Counter2, i;
    assert( p->pHTable != NULL );
    // replace the table
    pHTableOld = p->pHTable;
    nHTableOld = p->nHTable;
    p->nHTable = Abc_PrimeCudd( 2 * Gia_ManAndNum(p) ); 
    p->pHTable = ABC_CALLOC( int, p->nHTable );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < nHTableOld; i++ )
    for ( pThis = (pHTableOld[i]? Gia_ManObj(p, Abc_Lit2Var(pHTableOld[i])) : NULL),
          iNext = (pThis? pThis->Value : 0);  
          pThis;  pThis = (iNext? Gia_ManObj(p, Abc_Lit2Var(iNext)) : NULL),   
          iNext = (pThis? pThis->Value : 0)  )
    {
        pThis->Value = 0;
        pPlace = Gia_ManHashFind( p, Gia_ObjFaninLit0p(p, pThis), Gia_ObjFaninLit1p(p, pThis), Gia_ObjFaninLit2p(p, pThis) );
        assert( *pPlace == 0 ); // should not be there
        *pPlace = Abc_Var2Lit( Gia_ObjId(p, pThis), 0 );
        assert( *pPlace != 0 );
        Counter++;
    }
    Counter2 = Gia_ManAndNum(p) - Gia_ManBufNum(p);
    assert( Counter == Counter2 );
    ABC_FREE( pHTableOld );
//    if ( p->fVerbose )
//        printf( "Resizing GIA hash table: %d -> %d.\n", nHTableOld, p->nHTable );
}